

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringNotContains>::operator()
          (Comparator<Corrade::TestSuite::Compare::StringNotContains> *this,StringView actual,
          StringView expectedToNotContain)

{
  UnderlyingType UVar1;
  bool bVar2;
  StringView actual_local;
  
  actual_local._sizePlusFlags = actual._sizePlusFlags;
  actual_local._data = actual._data;
  (this->_actualValue)._data = actual_local._data;
  (this->_actualValue)._sizePlusFlags = actual_local._sizePlusFlags;
  (this->_expectedToNotContainValue)._data = expectedToNotContain._data;
  (this->_expectedToNotContainValue)._sizePlusFlags = expectedToNotContain._sizePlusFlags;
  bVar2 = Containers::BasicStringView<const_char>::contains(&actual_local,expectedToNotContain);
  UVar1 = '\b';
  if (bVar2) {
    UVar1 = '\x01';
  }
  return (ComparisonStatusFlags)UVar1;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::StringNotContains>::operator()(const Containers::StringView actual, const Containers::StringView expectedToNotContain) {
    _actualValue = actual;
    _expectedToNotContainValue = expectedToNotContain;

    /* Unlike the other comparators, here it can't pass if the strings are the
       same, meaning we report the verbose message always */
    if(actual.contains(expectedToNotContain)) return ComparisonStatusFlag::Failed;
    return ComparisonStatusFlag::Verbose;
}